

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O3

void Fxu_HeapDoubleInsert(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  uint uVar1;
  Fxu_Double **__ptr;
  ulong __size;
  int iVar2;
  
  iVar2 = p->nItems;
  __ptr = p->pTree;
  if (iVar2 == p->nItemsAlloc) {
    p->nItemsAlloc = iVar2 * 2;
    __size = (long)iVar2 << 4 | 8;
    if (__ptr == (Fxu_Double **)0x0) {
      __ptr = (Fxu_Double **)malloc(__size);
    }
    else {
      __ptr = (Fxu_Double **)realloc(__ptr,__size);
      iVar2 = p->nItems;
    }
    p->pTree = __ptr;
  }
  uVar1 = iVar2 + 1;
  p->nItems = uVar1;
  __ptr[(long)iVar2 + 1] = pDiv;
  pDiv->HNum = uVar1;
  Fxu_HeapDoubleMoveUp(p,(Fxu_Double *)(ulong)uVar1);
  return;
}

Assistant:

void Fxu_HeapDoubleInsert( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
    if ( p->nItems == p->nItemsAlloc )
        Fxu_HeapDoubleResize( p );
    // put the last entry to the last place and move up
    p->pTree[++p->nItems] = pDiv;
    pDiv->HNum = p->nItems;
    // move the last entry up if necessary
    Fxu_HeapDoubleMoveUp( p, pDiv );
}